

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

Kit_DsdObj_t * Kit_DsdObjAlloc(Kit_DsdNtk_t *pNtk,Kit_Dsd_t Type,int nFans)

{
  int iVar1;
  Kit_DsdObj_t *pKVar2;
  Kit_DsdObj_t **ppKVar3;
  ushort uVar4;
  int iVar5;
  ulong __size;
  uint uVar6;
  uint uVar7;
  
  uVar7 = (nFans & 1U) + (nFans >> 1);
  iVar5 = 1 << ((char)nFans - 5U & 0x1f);
  if (nFans < 6) {
    iVar5 = 1;
  }
  iVar1 = 0;
  if (Type == KIT_DSD_PRIME) {
    iVar1 = iVar5;
  }
  pKVar2 = (Kit_DsdObj_t *)calloc(1,(long)(int)((iVar1 + uVar7) * 4 + 4));
  uVar6 = *(uint *)&pNtk->nNodes;
  *pKVar2 = (Kit_DsdObj_t)
            ((uVar7 & 0xff) << 10 | nFans << 0x1a | (Type & (KIT_DSD_XOR|KIT_DSD_AND)) << 6 |
             (uint)*pKVar2 & 0x3fc0200 | uVar6 + *(int *)pNtk & 0x3f);
  uVar4 = pNtk->nNodesAlloc;
  if ((ushort)uVar6 == uVar4) {
    uVar4 = (ushort)uVar6 * 2;
    pNtk->nNodesAlloc = uVar4;
    __size = (ulong)((uVar6 & 0x7fff) << 4);
    if (pNtk->pNodes == (Kit_DsdObj_t **)0x0) {
      ppKVar3 = (Kit_DsdObj_t **)malloc(__size);
    }
    else {
      ppKVar3 = (Kit_DsdObj_t **)realloc(pNtk->pNodes,__size);
      uVar4 = pNtk->nNodesAlloc;
      uVar6 = (uint)pNtk->nNodes;
    }
    pNtk->pNodes = ppKVar3;
  }
  if ((ushort)uVar6 < uVar4) {
    pNtk->nNodes = (ushort)uVar6 + 1;
    pNtk->pNodes[uVar6 & 0xffff] = pKVar2;
    return pKVar2;
  }
  __assert_fail("pNtk->nNodes < pNtk->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x6d,"Kit_DsdObj_t *Kit_DsdObjAlloc(Kit_DsdNtk_t *, Kit_Dsd_t, int)");
}

Assistant:

Kit_DsdObj_t * Kit_DsdObjAlloc( Kit_DsdNtk_t * pNtk, Kit_Dsd_t Type, int nFans )
{
    Kit_DsdObj_t * pObj;
    int nSize = sizeof(Kit_DsdObj_t) + sizeof(unsigned) * (Kit_DsdObjOffset(nFans) + (Type == KIT_DSD_PRIME) * Kit_TruthWordNum(nFans));
    pObj = (Kit_DsdObj_t *)ABC_ALLOC( char, nSize );
    memset( pObj, 0, (size_t)nSize );
    pObj->Id = pNtk->nVars + pNtk->nNodes;
    pObj->Type = Type;
    pObj->nFans = nFans;
    pObj->Offset = Kit_DsdObjOffset( nFans );
    // add the object
    if ( pNtk->nNodes == pNtk->nNodesAlloc )
    {
        pNtk->nNodesAlloc *= 2;
        pNtk->pNodes = ABC_REALLOC( Kit_DsdObj_t *, pNtk->pNodes, pNtk->nNodesAlloc ); 
    }
    assert( pNtk->nNodes < pNtk->nNodesAlloc );
    pNtk->pNodes[pNtk->nNodes++] = pObj;
    return pObj;
}